

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr * __thiscall c4::yml::Tree::key_tag(Tree *this,size_t node)

{
  code *pcVar1;
  bool bVar2;
  csubstr *pcVar3;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pcVar3 = (csubstr *)(*pcVar1)();
        return pcVar3;
      }
    }
    (*(code *)PTR_error_impl_0023b518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((~(int)this->m_buf[node].m_type.type & 0x402U) != 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pcVar3 = (csubstr *)(*pcVar1)();
        return pcVar3;
      }
    }
    (*(code *)PTR_error_impl_0023b518)
              ("check failed: has_key_tag(node)",0x1f,(anonymous_namespace)::s_default_callbacks);
  }
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pcVar3 = (csubstr *)(*pcVar1)();
        return pcVar3;
      }
    }
    (*(code *)PTR_error_impl_0023b518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  return &this->m_buf[node].m_key.tag;
}

Assistant:

csubstr    const& key_tag   (size_t node) const { RYML_ASSERT(has_key_tag(node)); return _p(node)->m_key.tag; }